

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_address.cpp
# Opt level: O0

OutputDescriptorResponseStruct *
cfd::js::api::AddressStructApi::AppendDescriptorChecksum
          (OutputDescriptorResponseStruct *__return_storage_ptr__,
          AppendDescriptorChecksumRequestStruct *request)

{
  AppendDescriptorChecksumRequestStruct *this;
  string *in_R8;
  allocator local_129;
  function<cfd::js::api::OutputDescriptorResponseStruct_(const_cfd::js::api::AppendDescriptorChecksumRequestStruct_&)>
  local_128;
  undefined1 local_108 [238];
  undefined1 local_1a;
  anon_class_1_0_00000001 local_19;
  AppendDescriptorChecksumRequestStruct *pAStack_18;
  anon_class_1_0_00000001 call_func;
  AppendDescriptorChecksumRequestStruct *request_local;
  OutputDescriptorResponseStruct *result;
  
  local_1a = 0;
  pAStack_18 = request;
  OutputDescriptorResponseStruct::OutputDescriptorResponseStruct(__return_storage_ptr__);
  this = pAStack_18;
  std::
  function<cfd::js::api::OutputDescriptorResponseStruct(cfd::js::api::AppendDescriptorChecksumRequestStruct_const&)>
  ::
  function<cfd::js::api::AddressStructApi::AppendDescriptorChecksum(cfd::js::api::AppendDescriptorChecksumRequestStruct_const&)::__0&,void>
            ((function<cfd::js::api::OutputDescriptorResponseStruct(cfd::js::api::AppendDescriptorChecksumRequestStruct_const&)>
              *)local_108,&local_19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_128,"AppendDescriptorChecksum",&local_129);
  ExecuteStructApi<cfd::js::api::AppendDescriptorChecksumRequestStruct,cfd::js::api::OutputDescriptorResponseStruct>
            ((OutputDescriptorResponseStruct *)(local_108 + 0x20),(api *)this,
             (AppendDescriptorChecksumRequestStruct *)local_108,&local_128,in_R8);
  OutputDescriptorResponseStruct::operator=
            (__return_storage_ptr__,(OutputDescriptorResponseStruct *)(local_108 + 0x20));
  OutputDescriptorResponseStruct::~OutputDescriptorResponseStruct
            ((OutputDescriptorResponseStruct *)(local_108 + 0x20));
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  std::
  function<cfd::js::api::OutputDescriptorResponseStruct_(const_cfd::js::api::AppendDescriptorChecksumRequestStruct_&)>
  ::~function((function<cfd::js::api::OutputDescriptorResponseStruct_(const_cfd::js::api::AppendDescriptorChecksumRequestStruct_&)>
               *)local_108);
  return __return_storage_ptr__;
}

Assistant:

OutputDescriptorResponseStruct AddressStructApi::AppendDescriptorChecksum(
    const AppendDescriptorChecksumRequestStruct& request) {
  auto call_func = [](const AppendDescriptorChecksumRequestStruct& request)
      -> OutputDescriptorResponseStruct {  // NOLINT
    OutputDescriptorResponseStruct response;

    Descriptor descriptor = Descriptor::Parse(request.descriptor);

    response.descriptor = descriptor.ToString();
    return response;
  };

  OutputDescriptorResponseStruct result;
  result = ExecuteStructApi<
      AppendDescriptorChecksumRequestStruct, OutputDescriptorResponseStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}